

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> __thiscall
helics::FederateInfo::makeCLIApp(FederateInfo *this)

{
  int iVar1;
  pointer phVar2;
  OptionDefaults *pOVar3;
  App *pAVar4;
  Option *pOVar5;
  Option_group *pOVar6;
  pointer option_description;
  Option *pOVar7;
  pointer this_00;
  Option *this_01;
  long in_RSI;
  __uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
  in_RDI;
  Option_group *rtgroup;
  Option_group *encrypt_group;
  App *brokersub;
  App *networking;
  HelicsConfigJSON *fmtr;
  __single_object *app;
  undefined7 in_stack_ffffffffffffe008;
  undefined1 in_stack_ffffffffffffe00f;
  App *in_stack_ffffffffffffe010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe018;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_ffffffffffffe020;
  char __c;
  Validator *in_stack_ffffffffffffe028;
  Validator *in_stack_ffffffffffffe030;
  undefined4 in_stack_ffffffffffffe040;
  undefined4 in_stack_ffffffffffffe044;
  char *in_stack_ffffffffffffe048;
  allocator<char> *paVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe050;
  string *in_stack_ffffffffffffe060;
  Validator *in_stack_ffffffffffffe068;
  Option *in_stack_ffffffffffffe070;
  filter_fn_t *in_stack_ffffffffffffe078;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *func;
  filter_fn_t *in_stack_ffffffffffffe080;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  **in_stack_ffffffffffffe088;
  CheckedTransformer *in_stack_ffffffffffffe090;
  IsMember *this_03;
  string *in_stack_ffffffffffffe098;
  string *in_stack_ffffffffffffe0a0;
  string *in_stack_ffffffffffffe0a8;
  CoreType type;
  App *in_stack_ffffffffffffe0b0;
  string *option_name;
  string *in_stack_ffffffffffffe0d0;
  string *in_stack_ffffffffffffe0d8;
  App *in_stack_ffffffffffffe0e0;
  string *in_stack_ffffffffffffe0e8;
  App *in_stack_ffffffffffffe0f0;
  string *in_stack_ffffffffffffe0f8;
  function<void_(long)> *in_stack_ffffffffffffe100;
  string *in_stack_ffffffffffffe108;
  App *in_stack_ffffffffffffe110;
  string *in_stack_ffffffffffffe118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe120;
  string *in_stack_ffffffffffffe128;
  App *in_stack_ffffffffffffe130;
  App *this_04;
  string *in_stack_ffffffffffffe138;
  App *in_stack_ffffffffffffe140;
  string *in_stack_ffffffffffffe158;
  string *in_stack_ffffffffffffe160;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_ffffffffffffe168;
  Option *in_stack_ffffffffffffe170;
  string *in_stack_ffffffffffffe180;
  string *in_stack_ffffffffffffe188;
  App *in_stack_ffffffffffffe190;
  App *in_stack_ffffffffffffe200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18c0;
  allocator<char> local_1899 [40];
  allocator<char> local_1871 [40];
  allocator<char> local_1849 [40];
  allocator<char> local_1821 [40];
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_17f9;
  allocator<char> local_17d1 [65];
  undefined1 local_1790 [255];
  allocator<char> local_1691 [97];
  undefined1 *local_1630;
  string local_1551 [2];
  allocator<char> local_1501 [40];
  allocator<char> local_14d9 [144];
  allocator<char> local_1449 [80];
  allocator<char> local_13f9 [40];
  allocator<char> local_13d1 [80];
  allocator<char> local_1381 [40];
  undefined1 local_1359 [80];
  undefined1 local_1309 [120];
  allocator<char> local_1291 [40];
  allocator<char> local_1269 [80];
  allocator<char> local_1219 [40];
  allocator<char> local_11f1 [80];
  allocator<char> local_11a1 [40];
  allocator<char> local_1179 [80];
  allocator<char> local_1129 [40];
  allocator<char> local_1101 [40];
  allocator<char> local_10d9 [33];
  App *local_10b8;
  allocator<char> local_10a9 [40];
  allocator<char> local_1081 [40];
  allocator<char> local_1059 [40];
  allocator<char> local_1031 [40];
  allocator<char> local_1009 [40];
  allocator<char> local_fe1 [40];
  allocator<char> local_fb9 [40];
  allocator<char> local_f91 [33];
  Option_group *local_f70;
  allocator<char> local_f61 [80];
  allocator<char> local_f11 [40];
  allocator<char> local_ee9 [80];
  allocator<char> local_e99 [40];
  allocator<char> local_e71 [80];
  allocator<char> local_e21 [40];
  allocator<char> local_df9 [80];
  allocator<char> local_da9 [40];
  allocator<char> local_d81 [40];
  allocator<char> local_d59 [40];
  allocator<char> local_d31 [40];
  allocator<char> local_d09 [40];
  allocator<char> local_ce1 [40];
  allocator<char> local_cb9 [80];
  allocator<char> local_c69 [40];
  allocator<char> local_c41 [40];
  allocator<char> local_c19 [40];
  allocator<char> local_bf1 [80];
  allocator<char> local_ba1 [40];
  allocator<char> local_b79 [40];
  allocator<char> local_b51 [40];
  allocator<char> local_b29 [40];
  allocator<char> local_b01 [40];
  allocator<char> local_ad9 [40];
  allocator<char> local_ab1 [40];
  allocator<char> local_a89 [40];
  allocator<char> local_a61 [40];
  allocator<char> local_a39 [144];
  allocator<char> local_9a9 [80];
  allocator<char> local_959 [40];
  allocator<char> local_931 [40];
  allocator<char> local_909 [80];
  allocator<char> local_8b9 [40];
  allocator<char> local_891 [40];
  allocator<char> local_869 [40];
  allocator<char> local_841 [40];
  allocator<char> local_819 [40];
  allocator<char> local_7f1 [40];
  allocator<char> local_7c9 [40];
  allocator<char> local_7a1 [40];
  allocator<char> local_779 [40];
  allocator<char> local_751 [40];
  allocator<char> local_729 [40];
  allocator<char> local_701 [33];
  App *local_6e0;
  allocator<char> local_6d1 [144];
  allocator<char> local_641 [40];
  allocator<char> local_619 [40];
  allocator<char> local_5f1 [40];
  allocator<char> local_5c9 [40];
  allocator<char> local_5a1 [40];
  allocator<char> local_579 [80];
  allocator<char> local_529 [40];
  allocator<char> local_501 [40];
  allocator<char> local_4d9 [40];
  allocator<char> local_4b1 [40];
  allocator<char> local_489 [80];
  allocator<char> local_439 [40];
  allocator<char> local_411 [40];
  allocator<char> local_3e9 [40];
  allocator<char> local_3c1 [40];
  allocator<char> local_399 [136];
  allocator<char> local_311 [80];
  allocator<char> local_2c1 [40];
  allocator<char> local_299 [40];
  allocator<char> local_271 [136];
  allocator<char> local_1e9 [80];
  allocator<char> local_199 [40];
  allocator<char> local_171 [40];
  allocator<char> local_149 [33];
  App *local_128;
  allocator<char> local_119 [40];
  allocator<char> local_f1 [40];
  allocator<char> local_c9 [33];
  HelicsConfigJSON *local_a8;
  allocator<char> local_99 [40];
  allocator<char> local_71 [40];
  allocator<char> local_49 [56];
  undefined1 local_11;
  
  local_11 = 0;
  std::make_unique<helics::helicsCLI11App,char_const(&)[22]>
            ((char (*) [22])in_stack_ffffffffffffe098);
  phVar2 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x346c4b);
  pOVar3 = CLI::App::option_defaults(&phVar2->super_App);
  pOVar3 = CLI::OptionDefaults::ignore_case(pOVar3,true);
  CLI::OptionDefaults::ignore_underscore(pOVar3,true);
  phVar2 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x346c9a);
  CLI::App::allow_config_extras(&phVar2->super_App,ignore_all);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x346cb6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::set_config
            (in_stack_ffffffffffffe0b0,in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0,
             in_stack_ffffffffffffe098,SUB81((ulong)in_stack_ffffffffffffe090 >> 0x38,0));
  type = (CoreType)((ulong)in_stack_ffffffffffffe0a8 >> 0x20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_99);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_71);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_49);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::get
            ((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             in_stack_ffffffffffffe010);
  local_a8 = addJsonConfig(in_stack_ffffffffffffe200);
  CLI::ConfigBase::maxLayers(&local_a8->super_ConfigBase,'\0');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  HelicsConfigJSON::promoteSection
            ((HelicsConfigJSON *)in_stack_ffffffffffffe010,
             (string *)CONCAT17(in_stack_ffffffffffffe00f,in_stack_ffffffffffffe008));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_c9);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x346e90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe130,in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,
             in_stack_ffffffffffffe118);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_119);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_f1);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x346f7c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_option_group<CLI::Option_group>
            (in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0);
  pAVar4 = CLI::App::immediate_callback(in_stack_ffffffffffffe010,(bool)in_stack_ffffffffffffe00f);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_171);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_149);
  local_128 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(std::__cxx11::string_const&)>::
  function<helics::FederateInfo::makeCLIApp()::__0,void>
            ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_ffffffffffffe020,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_option_function<std::__cxx11::string>
            (in_stack_ffffffffffffe140,in_stack_ffffffffffffe138,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_ffffffffffffe130,in_stack_ffffffffffffe128);
  helics::core::to_string_abi_cxx11_(type);
  std::operator+((char *)in_stack_ffffffffffffe018,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe010);
  std::operator+(in_stack_ffffffffffffe018,(char *)in_stack_ffffffffffffe010);
  CLI::Option::default_str
            ((Option *)in_stack_ffffffffffffe010,
             (string *)CONCAT17(in_stack_ffffffffffffe00f,in_stack_ffffffffffffe008));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1e9);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x3471f6);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0e8,(bool *)in_stack_ffffffffffffe0e0,
             in_stack_ffffffffffffe0d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_299);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(std::__cxx11::string_const&)>::
  function<helics::FederateInfo::makeCLIApp()::__1,void>
            ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_ffffffffffffe020,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_option_function<std::__cxx11::string>
            (in_stack_ffffffffffffe140,in_stack_ffffffffffffe138,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_ffffffffffffe130,in_stack_ffffffffffffe128);
  helics::core::to_string_abi_cxx11_(type);
  std::operator+((char *)in_stack_ffffffffffffe018,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe010);
  std::operator+(in_stack_ffffffffffffe018,(char *)in_stack_ffffffffffffe010);
  CLI::Option::default_str
            ((Option *)in_stack_ffffffffffffe010,
             (string *)CONCAT17(in_stack_ffffffffffffe00f,in_stack_ffffffffffffe008));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::Option::envname
            ((Option *)in_stack_ffffffffffffe010,
             (string *)CONCAT17(in_stack_ffffffffffffe00f,in_stack_ffffffffffffe008));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_399);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_311);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x3474e6);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_2c1);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x34750d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe130,in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,
             in_stack_ffffffffffffe118);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_3e9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_3c1);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x3475f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe130,in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,
             in_stack_ffffffffffffe118);
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<helics::FederateInfo::makeCLIApp()::__2,void>
            (in_stack_ffffffffffffe020,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar5 = CLI::Option::transform
                     (in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,in_stack_ffffffffffffe160,
                      in_stack_ffffffffffffe158);
  CLI::Option::multi_option_policy(pOVar5,Join);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::Option::envname
            ((Option *)in_stack_ffffffffffffe010,
             (string *)CONCAT17(in_stack_ffffffffffffe00f,in_stack_ffffffffffffe008));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_4d9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_4b1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_489);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x347817);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_439);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_411);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x347858);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe130,in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,
             in_stack_ffffffffffffe118);
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<helics::FederateInfo::makeCLIApp()::__3,void>
            (in_stack_ffffffffffffe020,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar5 = CLI::Option::transform
                     (in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,in_stack_ffffffffffffe160,
                      in_stack_ffffffffffffe158);
  CLI::Option::multi_option_policy(pOVar5,Join);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_5a1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_579);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x347a0a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_529);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_501);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x347a4b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe130,in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,
             in_stack_ffffffffffffe118);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_5f1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_5c9);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x347b37);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe130,in_stack_ffffffffffffe128,(int *)in_stack_ffffffffffffe120,
             in_stack_ffffffffffffe118);
  CLI::Validator::Validator(in_stack_ffffffffffffe030,in_stack_ffffffffffffe028);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::Option::check(in_stack_ffffffffffffe070,in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_6d1);
  CLI::Validator::~Validator((Validator *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_641);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_619);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x347cb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pAVar4 = CLI::App::add_subcommand
                     (in_stack_ffffffffffffe190,in_stack_ffffffffffffe188,in_stack_ffffffffffffe180)
  ;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_729);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_701);
  local_6e0 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe130,in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,
             in_stack_ffffffffffffe118);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_779);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_751);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe130,in_stack_ffffffffffffe128,(int *)in_stack_ffffffffffffe120,
             in_stack_ffffffffffffe118);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_7c9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_7a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0e8,(bool *)in_stack_ffffffffffffe0e0,
             in_stack_ffffffffffffe0d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_819);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_7f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe130,in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,
             in_stack_ffffffffffffe118);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_869);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe130,in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,
             in_stack_ffffffffffffe118);
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<helics::FederateInfo::makeCLIApp()::__4,void>
            (in_stack_ffffffffffffe020,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar5 = CLI::Option::transform
                     (in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,in_stack_ffffffffffffe160,
                      in_stack_ffffffffffffe158);
  CLI::Option::multi_option_policy(pOVar5,Join);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_931);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_909);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x3482e3);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_8b9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_891);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x348324);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(int_const&)>::function<helics::FederateInfo::makeCLIApp()::__5,void>
            ((function<void_(const_int_&)> *)in_stack_ffffffffffffe020,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_option_function<int>
            (in_stack_ffffffffffffe140,in_stack_ffffffffffffe138,
             (function<void_(const_int_&)> *)in_stack_ffffffffffffe130,in_stack_ffffffffffffe128);
  CLI::Validator::Validator(in_stack_ffffffffffffe030,in_stack_ffffffffffffe028);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::Option::check(in_stack_ffffffffffffe070,in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_a39);
  CLI::Validator::~Validator((Validator *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_9a9);
  CLI::std::function<void_(const_int_&)>::~function((function<void_(const_int_&)> *)0x34849c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_959);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x3484c3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe130,in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,
             in_stack_ffffffffffffe118);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_a89);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_a61);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x3485af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0e8,(bool *)in_stack_ffffffffffffe0e0,
             in_stack_ffffffffffffe0d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_ad9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_ab1);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x348699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0e8,(bool *)in_stack_ffffffffffffe0e0,
             in_stack_ffffffffffffe0d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_b29);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_b01);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x348783);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0e8,(bool *)in_stack_ffffffffffffe0e0,
             in_stack_ffffffffffffe0d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_b79);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_b51);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x34886d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(long)>::function<helics::FederateInfo::makeCLIApp()::__6,void>
            ((function<void_(long)> *)in_stack_ffffffffffffe020,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_flag_function
            (in_stack_ffffffffffffe110,in_stack_ffffffffffffe108,in_stack_ffffffffffffe100,
             in_stack_ffffffffffffe0f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_bf1);
  CLI::std::function<void_(long)>::~function((function<void_(long)> *)0x34894e);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_ba1);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x348975);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0e8,(bool *)in_stack_ffffffffffffe0e0,
             in_stack_ffffffffffffe0d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_c41);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_c19);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x348a5f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void()>::function<helics::FederateInfo::makeCLIApp()::__7,void>
            ((function<void_()> *)in_stack_ffffffffffffe020,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_flag_callback
            (in_stack_ffffffffffffe110,in_stack_ffffffffffffe108,
             (function<void_()> *)in_stack_ffffffffffffe100,in_stack_ffffffffffffe0f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_cb9);
  std::function<void_()>::~function((function<void_()> *)0x348b40);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_c69);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x348b67);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (in_stack_ffffffffffffe130,in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,
                      in_stack_ffffffffffffe118);
  CLI::Option::expected(pOVar5,0,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::Option::default_str
            ((Option *)in_stack_ffffffffffffe010,
             (string *)CONCAT17(in_stack_ffffffffffffe00f,in_stack_ffffffffffffe008));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_d31);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_d09);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_ce1);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x348cdb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe130,in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,
             in_stack_ffffffffffffe118);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_d81);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_d59);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x348dc7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(TimeRepresentation<count_time<9,long>>const&)>::
  function<helics::FederateInfo::makeCLIApp()::__8,void>
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
             in_stack_ffffffffffffe020,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar5 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (in_stack_ffffffffffffe140,in_stack_ffffffffffffe138,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      in_stack_ffffffffffffe130,in_stack_ffffffffffffe128);
  CLI::OptionBase<CLI::Option>::configurable(&pOVar5->super_OptionBase<CLI::Option>,false);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_df9);
  CLI::std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)>::~function
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)0x348ec1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_da9);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x348ee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(TimeRepresentation<count_time<9,long>>const&)>::
  function<helics::FederateInfo::makeCLIApp()::__9,void>
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
             in_stack_ffffffffffffe020,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar5 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (in_stack_ffffffffffffe140,in_stack_ffffffffffffe138,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      in_stack_ffffffffffffe130,in_stack_ffffffffffffe128);
  CLI::OptionBase<CLI::Option>::configurable(&pOVar5->super_OptionBase<CLI::Option>,false);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_e71);
  CLI::std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)>::~function
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)0x348fe2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_e21);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x349009);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(TimeRepresentation<count_time<9,long>>const&)>::
  function<helics::FederateInfo::makeCLIApp()::__10,void>
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
             in_stack_ffffffffffffe020,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar5 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (in_stack_ffffffffffffe140,in_stack_ffffffffffffe138,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      in_stack_ffffffffffffe130,in_stack_ffffffffffffe128);
  CLI::OptionBase<CLI::Option>::configurable(&pOVar5->super_OptionBase<CLI::Option>,false);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_ee9);
  CLI::std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)>::~function
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)0x349103);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_e99);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x34912a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(TimeRepresentation<count_time<9,long>>const&)>::
  function<helics::FederateInfo::makeCLIApp()::__11,void>
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
             in_stack_ffffffffffffe020,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar5 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (in_stack_ffffffffffffe140,in_stack_ffffffffffffe138,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      in_stack_ffffffffffffe130,in_stack_ffffffffffffe128);
  CLI::OptionBase<CLI::Option>::configurable(&pOVar5->super_OptionBase<CLI::Option>,false);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_f61);
  CLI::std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)>::~function
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)0x349224);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_f11);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x34924b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar6 = CLI::App::add_option_group<CLI::Option_group>
                     (in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0)
  ;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_fb9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_f91);
  local_f70 = pOVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0e8,(bool *)in_stack_ffffffffffffe0e0,
             in_stack_ffffffffffffe0d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::Option::envname
            ((Option *)in_stack_ffffffffffffe010,
             (string *)CONCAT17(in_stack_ffffffffffffe00f,in_stack_ffffffffffffe008));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1031);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1009);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_fe1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffe130,in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,
             in_stack_ffffffffffffe118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::Option::envname
            ((Option *)in_stack_ffffffffffffe010,
             (string *)CONCAT17(in_stack_ffffffffffffe00f,in_stack_ffffffffffffe008));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_10a9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1081);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1059);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x3495d3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pAVar4 = &CLI::App::add_option_group<CLI::Option_group>
                      (in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0
                      )->super_App;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1101);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_10d9);
  local_10b8 = pAVar4;
  pOVar3 = CLI::App::option_defaults(pAVar4);
  CLI::OptionDefaults::ignore_underscore(pOVar3,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(TimeRepresentation<count_time<9,long>>const&)>::
  function<helics::FederateInfo::makeCLIApp()::__12,void>
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
             in_stack_ffffffffffffe020,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar5 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (in_stack_ffffffffffffe140,in_stack_ffffffffffffe138,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      in_stack_ffffffffffffe130,in_stack_ffffffffffffe128);
  CLI::OptionBase<CLI::Option>::configurable(&pOVar5->super_OptionBase<CLI::Option>,false);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1179);
  CLI::std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)>::~function
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)0x3497d9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(TimeRepresentation<count_time<9,long>>const&)>::
  function<helics::FederateInfo::makeCLIApp()::__13,void>
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
             in_stack_ffffffffffffe020,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar5 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (in_stack_ffffffffffffe140,in_stack_ffffffffffffe138,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      in_stack_ffffffffffffe130,in_stack_ffffffffffffe128);
  CLI::OptionBase<CLI::Option>::configurable(&pOVar5->super_OptionBase<CLI::Option>,false);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_11f1);
  CLI::std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)>::~function
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)0x3498f5);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_11a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(TimeRepresentation<count_time<9,long>>const&)>::
  function<helics::FederateInfo::makeCLIApp()::__14,void>
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
             in_stack_ffffffffffffe020,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar5 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (in_stack_ffffffffffffe140,in_stack_ffffffffffffe138,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      in_stack_ffffffffffffe130,in_stack_ffffffffffffe128);
  CLI::OptionBase<CLI::Option>::configurable(&pOVar5->super_OptionBase<CLI::Option>,false);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1269);
  CLI::std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)>::~function
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)0x349a11);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1219);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x349a38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(TimeRepresentation<count_time<9,long>>const&)>::
  function<helics::FederateInfo::makeCLIApp()::__15,void>
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
             in_stack_ffffffffffffe020,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar5 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (in_stack_ffffffffffffe140,in_stack_ffffffffffffe138,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      in_stack_ffffffffffffe130,in_stack_ffffffffffffe128);
  CLI::OptionBase<CLI::Option>::configurable(&pOVar5->super_OptionBase<CLI::Option>,false);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator((allocator<char> *)(local_1309 + 0x28));
  CLI::std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)>::~function
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)0x349b32);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1291);
  phVar2 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x349b59);
  pAVar4 = (App *)local_1309;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(TimeRepresentation<count_time<9,long>>const&)>::
  function<helics::FederateInfo::makeCLIApp()::__16,void>
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
             in_stack_ffffffffffffe020,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  this_04 = (App *)local_1359;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar5 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar4,(string *)phVar2,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)this_04,
                      in_stack_ffffffffffffe128);
  CLI::OptionBase<CLI::Option>::configurable(&pOVar5->super_OptionBase<CLI::Option>,false);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator((allocator<char> *)local_1359);
  CLI::std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)>::~function
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)0x349c53);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator((allocator<char> *)local_1309);
  option_description =
       CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
       operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                   *)0x349c7a);
  paVar8 = local_1381;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(TimeRepresentation<count_time<9,long>>const&)>::
  function<helics::FederateInfo::makeCLIApp()::__17,void>
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
             in_stack_ffffffffffffe020,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar7 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar4,(string *)phVar2,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)this_04,
                      (string *)pOVar5);
  CLI::OptionBase<CLI::Option>::configurable(&pOVar7->super_OptionBase<CLI::Option>,false);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_13d1);
  CLI::std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)>::~function
            ((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)0x349d74);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1381);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x349d9b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(int_const&)>::function<helics::FederateInfo::makeCLIApp()::__18,void>
            ((function<void_(const_int_&)> *)in_stack_ffffffffffffe020,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::App::add_option_function<int>
            (pAVar4,(string *)phVar2,(function<void_(const_int_&)> *)this_04,(string *)pOVar5);
  CLI::Validator::Validator(in_stack_ffffffffffffe030,in_stack_ffffffffffffe028);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::Option::check(in_stack_ffffffffffffe070,in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_14d9);
  CLI::Validator::~Validator((Validator *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1449);
  CLI::std::function<void_(const_int_&)>::~function((function<void_(const_int_&)> *)0x349f13);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_13f9);
  this_00 = CLI::std::
            unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
            operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                        *)0x349f3a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::function<void(int_const&)>::function<helics::FederateInfo::makeCLIApp()::__19,void>
            ((function<void_(const_int_&)> *)in_stack_ffffffffffffe020,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe018);
  option_name = local_1551;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar7 = CLI::App::add_option_function<int>
                     (pAVar4,(string *)phVar2,(function<void_(const_int_&)> *)this_04,
                      (string *)pOVar5);
  local_1630 = log_level_map_abi_cxx11_;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_ffffffffffffe020,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_ffffffffffffe018);
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_ffffffffffffe020,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_ffffffffffffe018);
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            (in_stack_ffffffffffffe090,in_stack_ffffffffffffe088,in_stack_ffffffffffffe080,
             in_stack_ffffffffffffe078);
  CLI::Validator::Validator
            ((Validator *)in_stack_ffffffffffffe010,
             (Validator *)CONCAT17(in_stack_ffffffffffffe00f,in_stack_ffffffffffffe008));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::Option::transform
            (in_stack_ffffffffffffe070,in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  local_1790._32_8_ = log_level_map_abi_cxx11_;
  this_03 = (IsMember *)local_1790;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_ffffffffffffe020,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_ffffffffffffe018);
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_ffffffffffffe020,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_ffffffffffffe018);
  __c = (char)((ulong)in_stack_ffffffffffffe020 >> 0x38);
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            (this_03,in_stack_ffffffffffffe088,in_stack_ffffffffffffe080,in_stack_ffffffffffffe078);
  CLI::Validator::Validator
            ((Validator *)in_stack_ffffffffffffe010,
             (Validator *)CONCAT17(in_stack_ffffffffffffe00f,in_stack_ffffffffffffe008));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  this_01 = CLI::Option::transform
                      (in_stack_ffffffffffffe070,in_stack_ffffffffffffe068,in_stack_ffffffffffffe060
                      );
  func = &local_17f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  CLI::Option::envname
            ((Option *)in_stack_ffffffffffffe010,
             (string *)CONCAT17(in_stack_ffffffffffffe00f,in_stack_ffffffffffffe008));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator((allocator<char> *)&local_17f9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_17d1);
  CLI::Validator::~Validator((Validator *)in_stack_ffffffffffffe010);
  CLI::IsMember::~IsMember((IsMember *)0x34a242);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x34a24f);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x34a25c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1691);
  CLI::Validator::~Validator((Validator *)in_stack_ffffffffffffe010);
  CLI::CheckedTransformer::~CheckedTransformer((CheckedTransformer *)0x34a290);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x34a29d);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x34a2aa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator((allocator<char> *)local_1551);
  CLI::std::function<void_(const_int_&)>::~function((function<void_(const_int_&)> *)0x34a2d1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1501);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x34a2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffe044,in_stack_ffffffffffffe040));
  pOVar5 = CLI::App::add_option<char,_char,_(CLI::detail::enabler)0>
                     (this_04,(string *)pOVar5,(char *)paVar8,(string *)option_description);
  iVar1 = (int)*(char *)(in_RSI + 0x4c);
  paVar8 = local_1871;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe030,(size_type)in_stack_ffffffffffffe028,__c,
             (allocator<char> *)in_stack_ffffffffffffe018);
  CLI::Option::default_str
            ((Option *)in_stack_ffffffffffffe010,
             (string *)CONCAT17(in_stack_ffffffffffffe00f,in_stack_ffffffffffffe008));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1871);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1849);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::~allocator(local_1821);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x34a43c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar5,
             (char *)paVar8,(allocator<char> *)CONCAT44(iVar1,in_stack_ffffffffffffe040));
  pOVar5 = CLI::App::add_option<const_char[28],_(CLI::detail::enabler)0>
                     (&this_00->super_App,option_name,(char (*) [28])pOVar7);
  pOVar5 = CLI::Option::type_size(pOVar5,-1);
  pOVar7 = CLI::OptionBase<CLI::Option>::delimiter(&pOVar5->super_OptionBase<CLI::Option>,',');
  this_02 = &local_18c0;
  std::function<void(std::__cxx11::string)>::function<helics::FederateInfo::makeCLIApp()::__20,void>
            ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)pOVar5,(anon_class_8_1_8991fb9c *)pOVar7);
  CLI::Option::each(this_01,func);
  CLI::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x34a502);
  std::__cxx11::string::~string(this_02);
  std::allocator<char>::~allocator(local_1899);
  phVar2 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x34a529);
  CLI::App::allow_extras(&phVar2->super_App,true);
  return (__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
          )(tuple<helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>)
           in_RDI.
           super___uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>
           .super__Head_base<0UL,_helics::helicsCLI11App_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<helicsCLI11App> FederateInfo::makeCLIApp()
{
    /*
    The parser for the command line options ignores underscores and cases so
    there's no need to explicitly support all three case styles. If users type
    in any of the normal HELICS variants (nocase, camelCase, and snake_case) it
    will work.
    */
    auto app = std::make_unique<helicsCLI11App>("Federate Info Parsing");
    app->option_defaults()->ignore_case()->ignore_underscore();
    app->allow_config_extras(CLI::config_extras_mode::ignore_all);
    app->set_config("--config-file,--config,config",
                    "helicsConfig.ini",
                    "specify a configuration file");

    auto* fmtr = addJsonConfig(app.get());
    fmtr->maxLayers(0);
    fmtr->promoteSection("helics");
    app->add_option("--name,-n", defName, "name of the federate");
    auto* networking = app->add_option_group("network type")->immediate_callback();
    networking
        ->add_option_function<std::string>(
            "--core",
            [this](const std::string& val) {
                coreType = coreTypeFromString(val);
                if (coreType == CoreType::UNRECOGNIZED) {
                    coreName = val;
                }
            },
            "type or name of the core to connect to")
        ->default_str("(" + to_string(coreType) + ")");
    networking->add_flag("--force_new_core",
                         forceNewCore,
                         "if set to true will force the federate to generate a new core");
    networking
        ->add_option_function<std::string>(
            "--coretype,-t",
            [this](const std::string& val) {
                coreType = coreTypeFromString(val);
                if (coreType == CoreType::UNRECOGNIZED) {
                    throw CLI::ValidationError(val + " is NOT a recognized core type");
                }
            },
            "type  of the core to connect to")
        ->default_str("(" + to_string(coreType) + ")")
        ->envname("HELICS_CORE_TYPE");
    app->add_option("--corename", coreName, "the name of the core to create or find");
    app->add_option("--coreinitstring,-i",
                    coreInitString,
                    "The initialization arguments for the core")
        ->transform([](std::string arg) {
            arg.insert(arg.begin(), ' ');
            return arg;
        })
        ->multi_option_policy(CLI::MultiOptionPolicy::Join)
        ->envname("HELICS_CORE_INIT_STRING");
    app->add_option("--brokerinitstring",
                    brokerInitString,
                    "The initialization arguments for the broker if autogenerated")
        ->transform([](std::string arg) {
            arg.insert(arg.begin(), ' ');
            return arg;
        })
        ->multi_option_policy(CLI::MultiOptionPolicy::Join);
    app->add_option("--broker,--brokeraddress", broker, "address or name of the broker to connect");
    app->add_option("--brokerport", brokerPort, "Port number of the Broker")
        ->check(CLI::PositiveNumber);

    auto* brokersub = app->add_subcommand("broker", "broker specific options");
    brokersub->add_option("--host,--name", broker, "address or name of the broker to connect");
    brokersub->add_option("--port", brokerPort, "port to connect to");
    brokersub->add_flag("--auto",
                        autobroker,
                        "tell the core to automatically generate a broker if needed");
    brokersub->add_option("--key",
                          key,
                          "specify a key to use to match a broker should match the broker key");
    brokersub
        ->add_option("--initstring",
                     brokerInitString,
                     "The initialization arguments for the broker if autogenerated")
        ->transform([](std::string arg) {
            arg.insert(arg.begin(), ' ');
            return arg;
        })
        ->multi_option_policy(CLI::MultiOptionPolicy::Join);
    app->add_option_function<int>(
           "--port",
           [this](int port) {
               if (brokerPort > 0) {
                   localport = std::to_string(port);
               } else {
                   brokerPort = port;
               }
           },
           "Specify the port number to use")
        ->check(CLI::PositiveNumber);
    app->add_option("--localport",
                    localport,
                    "Port number to use for connections to this federate");
    app->add_flag("--autobroker",
                  autobroker,
                  "tell the core to automatically generate a broker if needed");
    app->add_flag("--debugging",
                  debugging,
                  "tell the core to allow user debugging in a nicer fashion");
    app->add_flag("--observer",
                  observer,
                  "tell the federate/core that this federate is an observer");
    // this is added here to match the command arguments for a broker, also works as a flag
    app->add_flag_function(
        "--allow_remote_control,!--disable_remote_control",
        [this](int64_t val) { setFlagOption(HELICS_FLAG_ALLOW_REMOTE_CONTROL, (val > 0)); },
        "enable the federate to respond to certain remote operations such as disconnect");
    app->add_flag(
        "--json",
        useJsonSerialization,
        "tell the core and federate to use JSON based serialization for all messages, to ensure compatibility");
    app->add_flag_callback(
        "--reentrant",
        [this]() { setFlagOption(HELICS_FLAG_REENTRANT, true); },
        "specify that the federate can be reentrant (meaning it can stop and be restarted with the same name");
    app->add_option(
           "--profiler",
           profilerFileName,
           "Enable profiling and specify a file name (NOTE: use --profiler_append=<filename> in the core init string to append to an existing file)")
        ->expected(0, 1)
        ->default_str("log");
    app->add_option("--broker_key,--brokerkey,--brokerKey",
                    key,
                    "specify a key to use to match a broker should match the broker key");
    app->add_option_function<Time>(
           "--offset",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_OFFSET, val); },
           "the offset of the time steps (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--period",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_PERIOD, val); },
           "the execution cycle of the federate (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--stoptime",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_STOPTIME, val); },
           "the maximum simulation time of a federate (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--timedelta",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_DELTA, val); },
           "The minimum time between time grants for a Federate (default in ms)")
        ->configurable(false);
    auto* encrypt_group = app->add_option_group("encryption", "options related to encryption");
    encrypt_group->add_flag("--encrypted", encrypted, "enable encryption on the network")
        ->envname("HELICS_ENCRYPTION");
    encrypt_group
        ->add_option("--encryption_config",
                     encryptionConfig,
                     "set the configuration file for encryption options")
        ->envname("HELICS_ENCRYPTION_CONFIG");

    auto* rtgroup = app->add_option_group("realtime");
    rtgroup->option_defaults()->ignore_underscore();
    rtgroup
        ->add_option_function<Time>(
            "--rtlag",
            [this](Time val) { setProperty(HELICS_PROPERTY_TIME_RT_LAG, val); },
            "the amount of the time the federate is allowed to lag realtime before "
            "corrective action is taken (default in ms)")
        ->configurable(false);
    rtgroup
        ->add_option_function<Time>(
            "--rtlead",
            [this](Time val) { setProperty(HELICS_PROPERTY_TIME_RT_LEAD, val); },
            "the amount of the time the federate is allowed to lead realtime before "
            "corrective action is taken (default in ms)")
        ->configurable(false);
    rtgroup
        ->add_option_function<Time>(
            "--rttolerance",
            [this](Time val) { setProperty(HELICS_PROPERTY_TIME_RT_TOLERANCE, val); },
            "the time tolerance of the real time mode (default in ms)")
        ->configurable(false);

    app->add_option_function<Time>(
           "--inputdelay",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_INPUT_DELAY, val); },
           "the INPUT delay on incoming communication of the federate (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--outputdelay",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_OUTPUT_DELAY, val); },
           "the output delay for outgoing communication of the federate (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--grant_timeout",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_GRANT_TIMEOUT, val); },
           "timeout to trigger diagnostic action when a federate time grant is not available within the timeout period (default in ms)")
        ->configurable(false);
    app->add_option_function<int>(
           "--maxiterations",
           [this](int val) { setProperty(HELICS_PROPERTY_INT_MAX_ITERATIONS, val); },
           "the maximum number of iterations a federate is allowed to take")
        ->check(CLI::PositiveNumber);
    app->add_option_function<int>(
           "--loglevel",
           [this](int val) { setProperty(HELICS_PROPERTY_INT_LOG_LEVEL, val); },
           "the logging level of a federate")
        ->transform(
            CLI::CheckedTransformer(&log_level_map, CLI::ignore_case, CLI::ignore_underscore))

        ->transform(CLI::IsMember(&log_level_map, CLI::ignore_case, CLI::ignore_underscore))
        ->envname("HELICS_LOG_LEVEL");

    app->add_option("--separator", separator, "separator character for local federates")
        ->default_str(std::string(1, separator));
    app->add_option("--flags,-f,--flag", "named flag for the federate")
        ->type_size(-1)
        ->delimiter(',')
        ->each([this](const std::string& flag) { loadFlags(*this, flag); });
    app->allow_extras();
#ifdef HELICS_DISABLE_ASIO
    rtgroup->disabled();
#endif
    return app;
}